

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::ConvertIntImplInnerSlow
          (anon_unknown_53 *this,IntDigits *as_digits,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  undefined1 extraout_AL;
  byte bVar5;
  FormatSinkImpl *this_00;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *n;
  char *n_00;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  bool bVar16;
  string_view v;
  string_view v_00;
  string_view v_01;
  char *local_48;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_);
  uVar3 = (ulong)as_digits >> 8;
  pcVar8 = (char *)0x0;
  pcVar7 = (char *)((long)as_digits >> 0x20);
  if ((long)as_digits < 0) {
    pcVar7 = pcVar8;
  }
  uVar2 = *(ulong *)(this + 8);
  cVar1 = **(char **)this;
  uVar9 = (ulong)(cVar1 < '1');
  pcVar12 = (char *)(uVar2 - uVar9);
  pcVar14 = pcVar7 + -(long)pcVar12;
  if (pcVar7 < pcVar12) {
    pcVar14 = pcVar8;
  }
  bVar16 = ((uint)as_digits & 0xfe) == 2;
  local_48 = "-";
  if (!bVar16) {
    local_48 = pcVar8;
  }
  if (bVar16 && cVar1 != '-') {
    if ((uVar3 & 2) == 0) {
      local_48 = (char *)0x0;
      if ((uVar3 & 4) != 0) {
        local_48 = " ";
      }
      pcVar7 = (char *)(ulong)(((byte)((ulong)as_digits >> 8) & 4) >> 2);
    }
    else {
      pcVar7 = (char *)0x1;
      local_48 = "+";
    }
  }
  else {
    pcVar7 = (char *)(ulong)bVar16;
  }
  pcVar13 = *(char **)this + uVar9;
  pcVar8 = pcVar14 + -(long)pcVar7;
  if (pcVar14 < pcVar7) {
    pcVar8 = (char *)0x0;
  }
  bVar16 = ((uint)as_digits >> 0xb & 1) == 0;
  bVar5 = (byte)as_digits;
  uVar10 = 0x1ff3f >> (bVar5 & 0x1f);
  pcVar15 = (char *)(ulong)(((byte)~(uVar2 == uVar9 |
                                    (0x11 < bVar5 || bVar5 != 0x11 && bVar16) | (byte)uVar10) & 1) *
                           2);
  pcVar14 = pcVar8 + -(long)pcVar15;
  if (pcVar8 < pcVar15) {
    pcVar14 = (char *)0x0;
  }
  iVar6 = conv._0_4_;
  iVar11 = 1;
  if (-1 < iVar6) {
    iVar11 = iVar6;
  }
  pcVar8 = (char *)(long)iVar11;
  if ((bVar5 == 4 && (uVar3 & 8) != 0) &&
     (((uVar2 == uVar9 || (*pcVar13 != '0')) && (pcVar8 < pcVar12 + 1)))) {
    pcVar8 = pcVar12 + 1;
  }
  n_00 = (char *)0x0;
  n = pcVar8 + -(long)pcVar12;
  if (pcVar8 < pcVar12) {
    n = n_00;
  }
  pcVar8 = pcVar14 + -(long)n;
  if (pcVar14 < n) {
    pcVar8 = n_00;
  }
  if ((uVar3 & 1) == 0) {
    n_00 = pcVar8;
  }
  if (iVar6 < 0) {
    pcVar14 = n_00;
    pcVar4 = (char *)0x0;
    if ((uVar3 & 0x10) == 0) {
      pcVar14 = (char *)0x0;
      pcVar4 = n_00;
    }
    n_00 = pcVar4;
    n = n + (long)pcVar14;
  }
  pcVar14 = "0x";
  if (bVar5 == 7) {
    pcVar14 = "0X";
  }
  if (uVar2 == uVar9 || ((0x11 < bVar5 || bVar5 != 0x11 && bVar16) || (uVar10 & 1) != 0)) {
    pcVar14 = (char *)0x0;
  }
  if ((uVar3 & 1) == 0) {
    pcVar8 = (char *)0x0;
  }
  FormatSinkImpl::Append(this_00,(size_t)n_00,' ');
  v._M_str = local_48;
  v._M_len = (size_t)pcVar7;
  FormatSinkImpl::Append(this_00,v);
  v_00._M_str = pcVar14;
  v_00._M_len = (size_t)pcVar15;
  FormatSinkImpl::Append(this_00,v_00);
  FormatSinkImpl::Append(this_00,(size_t)n,'0');
  v_01._M_str = pcVar13;
  v_01._M_len = (size_t)pcVar12;
  FormatSinkImpl::Append(this_00,v_01);
  FormatSinkImpl::Append(this_00,(size_t)pcVar8,' ');
  return (bool)extraout_AL;
}

Assistant:

bool ConvertIntImplInnerSlow(const IntDigits &as_digits,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  // Print as a sequence of Substrings:
  //   [left_spaces][sign][base_indicator][zeroes][formatted][right_spaces]
  size_t fill = 0;
  if (conv.width() >= 0)
    fill = static_cast<size_t>(conv.width());

  string_view formatted = as_digits.without_neg_or_zero();
  ReducePadding(formatted, &fill);

  string_view sign = SignColumn(as_digits.is_negative(), conv);
  ReducePadding(sign, &fill);

  string_view base_indicator = BaseIndicator(as_digits, conv);
  ReducePadding(base_indicator, &fill);

  bool precision_specified = conv.precision() >= 0;
  size_t precision =
      precision_specified ? static_cast<size_t>(conv.precision()) : size_t{1};

  if (conv.has_alt_flag() &&
      conv.conversion_char() == FormatConversionCharInternal::o) {
    // From POSIX description of the '#' (alt) flag:
    //   "For o conversion, it increases the precision (if necessary) to
    //   force the first digit of the result to be zero."
    if (formatted.empty() || *formatted.begin() != '0') {
      size_t needed = formatted.size() + 1;
      precision = std::max(precision, needed);
    }
  }

  size_t num_zeroes = Excess(formatted.size(), precision);
  ReducePadding(num_zeroes, &fill);

  size_t num_left_spaces = !conv.has_left_flag() ? fill : 0;
  size_t num_right_spaces = conv.has_left_flag() ? fill : 0;

  // From POSIX description of the '0' (zero) flag:
  //   "For d, i, o, u, x, and X conversion specifiers, if a precision
  //   is specified, the '0' flag is ignored."
  if (!precision_specified && conv.has_zero_flag()) {
    num_zeroes += num_left_spaces;
    num_left_spaces = 0;
  }

  sink->Append(num_left_spaces, ' ');
  sink->Append(sign);
  sink->Append(base_indicator);
  sink->Append(num_zeroes, '0');
  sink->Append(formatted);
  sink->Append(num_right_spaces, ' ');
  return true;
}